

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void __thiscall trun::Process::OnStdErrData(Process *this,string *data)

{
  ProcessCallbackInterface *pPVar1;
  string local_38 [32];
  string *local_18;
  string *data_local;
  Process *this_local;
  
  if (this->callback != (ProcessCallbackInterface *)0x0) {
    pPVar1 = this->callback;
    local_18 = data;
    data_local = (string *)this;
    std::__cxx11::string::string(local_38,data);
    (*pPVar1->_vptr_ProcessCallbackInterface[3])(pPVar1,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void Process::OnStdErrData(std::string data) {
	if (callback != NULL) {
		callback->OnStdErrData(data);
	}
}